

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

bool __thiscall
Qentem::Value<wchar_t>::GroupBy
          (Value<wchar_t> *this,Value<wchar_t> *groupedValue,wchar_t *key,SizeT length)

{
  SizeT length_00;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  Value<wchar_t> *pVVar4;
  Value<wchar_t> *pVVar5;
  SizeT SVar6;
  byte bVar7;
  Value<wchar_t> *this_00;
  SizeT *pSVar8;
  bool bVar9;
  wchar_t *local_a0;
  SizeT local_8c;
  QNumber64 local_88;
  undefined8 uStack_80;
  HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  local_78;
  Value<wchar_t> *local_60;
  Value<wchar_t> *local_58;
  SizeT *local_50;
  anon_union_16_5_5c8fea6c_for_Value<wchar_t>_1 local_48;
  undefined1 local_38;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  if (this->type_ == Array) {
    _local_88 = (HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                 )(ZEXT816(0) << 0x40);
    this_00 = (this->field_0).array_.storage_;
    local_78 = _local_88;
    reset(groupedValue);
    bVar9 = true;
    groupedValue->type_ = Object;
    if (((this_00 != (Value<wchar_t> *)0x0) && (this_00->type_ == Object)) &&
       (bVar1 = HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                ::GetKeyIndex((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                               *)this_00,&local_8c,key,length), bVar1)) {
      length_00 = 0;
      local_58 = (this->field_0).array_.storage_ + (this->field_0).array_.index_;
      bVar1 = this_00 == local_58;
      if (bVar1) {
        length = 1;
LAB_00128dd8:
        bVar9 = false;
      }
      else {
        local_a0 = (wchar_t *)0x0;
        local_60 = groupedValue;
        do {
          bVar9 = this_00->type_ == Object;
          length = (SizeT)bVar9;
          if (!bVar9) goto LAB_00128dd8;
          uVar3 = (ulong)(this_00->field_0).array_.index_;
          if (uVar3 != 0) {
            SVar6 = 0;
            pSVar8 = (this_00->field_0).object_.
                     super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                     .hashTable_ + (this_00->field_0).array_.capacity_;
            local_50 = pSVar8 + uVar3 * 0xc;
            do {
              if ((pSVar8 == (SizeT *)0x0) || ((char)pSVar8[10] == '\0')) {
                length = 0;
                goto LAB_00128dd8;
              }
              pVVar5 = (Value<wchar_t> *)(pSVar8 + 6);
              pVVar4 = pVVar5;
              if (SVar6 == local_8c) {
                for (; pVVar4->type_ == ValuePtr; pVVar4 = (pVVar4->field_0).array_.storage_) {
                }
                switch(pVVar4->type_) {
                case String:
                  local_a0 = (pVVar4->field_0).string_.storage_;
                  length_00 = (pVVar4->field_0).array_.index_;
                  break;
                default:
                  local_78.index_ = 0;
                  bVar9 = false;
                  bVar2 = CopyValueTo<Qentem::StringStream<wchar_t>,void(Qentem::StringStream<wchar_t>,wchar_t_const*,unsigned_int)>
                                    (pVVar5,(StringStream<wchar_t> *)&local_78,(RealFormatInfo)0xf,
                                     (_func_void_StringStream<wchar_t>_wchar_t_ptr_uint *)0x0);
                  if (!bVar2) {
                    length = (SizeT)bVar1;
                    goto LAB_00128d91;
                  }
                  local_a0 = (wchar_t *)local_78.hashTable_;
                  length_00 = local_78.index_;
                  break;
                case True:
                  local_a0 = L"true";
                  length_00 = 4;
                  break;
                case False:
                  local_a0 = L"false";
                  length_00 = 5;
                  break;
                case Null:
                  local_a0 = L"null";
                  length_00 = 4;
                }
              }
              else {
                pVVar4 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::Get
                                   ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
                                    &local_88,*(Char_T **)pSVar8,pSVar8[2]);
                if (pVVar4 != pVVar5) {
                  reset(pVVar4);
                  copyValue(pVVar4,pVVar5);
                }
              }
              SVar6 = SVar6 + 1;
              pSVar8 = pSVar8 + 0xc;
            } while (pSVar8 != local_50);
          }
          pVVar5 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::Get
                             ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)local_60,
                              local_a0,length_00);
          if (pVVar5->type_ == Array) {
LAB_00128d47:
            local_48.number_.Natural = local_88;
            local_48._8_8_ = uStack_80;
            _local_88 = (HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                         )(ZEXT816(0) << 0x20);
            local_38 = 2;
            Array<Qentem::Value<wchar_t>_>::operator+=
                      ((Array<Qentem::Value<wchar_t>_> *)pVVar5,(Value<wchar_t> *)&local_48.array_);
            ~Value((Value<wchar_t> *)&local_48.array_);
          }
          else {
            if (pVVar5->type_ != Object) {
              reset(pVVar5);
              pVVar5->type_ = Array;
              goto LAB_00128d47;
            }
            HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::operator+=
                      ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)pVVar5,
                       (HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)&local_88);
          }
          this_00 = this_00 + 1;
          bVar9 = false;
          bVar1 = this_00 == local_58;
        } while (!bVar1);
      }
    }
LAB_00128d91:
    bVar7 = (byte)length;
    HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
    ::~HashTable((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                  *)&local_88);
    pSVar8 = local_78.hashTable_;
    if (local_78.hashTable_ != (SizeT *)0x0) {
      MemoryRecord::RemoveAllocation(local_78.hashTable_);
    }
    operator_delete(pSVar8);
    if (!bVar9) goto LAB_00128dbc;
  }
  bVar7 = 0;
LAB_00128dbc:
  return (bool)(bVar7 & 1);
}

Assistant:

bool GroupBy(Value &groupedValue, const Char_T *key, const SizeT length) const {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            StringStream<Char_T> stream;
            ObjectT              new_sub_obj;
            const Value         *item_   = array_.First();
            const Char_T        *str     = nullptr;
            SizeT                str_len = 0;
            SizeT                grouped_key_index;

            groupedValue.reset();
            groupedValue.setTypeToObject();

            if ((item_ != nullptr) && item_->isObject() && item_->object_.GetKeyIndex(grouped_key_index, key, length)) {
                const Value *end = array_.End();

                while (item_ != end) {
                    if ((item_ != nullptr) && item_->isObject()) {
                        SizeT count = 0;

                        const VItem *obj_item = item_->object_.First();
                        const VItem *obj_end  = item_->object_.End();

                        while (obj_item != obj_end) {
                            if ((obj_item != nullptr) && !(obj_item->Value.isUndefined())) {
                                if (count != grouped_key_index) {
                                    new_sub_obj[obj_item->Key] = obj_item->Value;
                                } else if (!(obj_item->Value.SetCharAndLength(str, str_len))) {
                                    stream.Clear();

                                    if (obj_item->Value.CopyValueTo(stream)) {
                                        str     = stream.First();
                                        str_len = stream.Length();
                                    } else {
                                        return false;
                                    }
                                }

                                ++count;
                                ++obj_item;
                                continue;
                            }

                            return false;
                        }

                        groupedValue.object_.Get(str, str_len) += Memory::Move(new_sub_obj);

                        ++item_;
                        continue;
                    }

                    return false;
                }

                return true;
            }
        } else if (type == ValueType::ValuePtr) {
            return value_->GroupBy(groupedValue, key, length);
        }

        return false;
    }